

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O3

void __thiscall LexerTest_LexHexInt_Test::TestBody(LexerTest_LexHexInt_Test *this)

{
  undefined2 uVar1;
  undefined4 uVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  char *pcVar5;
  char *in_R9;
  pointer *__ptr;
  string_view buffer;
  string_view buffer_00;
  string_view buffer_01;
  string_view buffer_02;
  string_view buffer_03;
  string_view buffer_04;
  string_view buffer_05;
  string_view buffer_06;
  string_view buffer_07;
  string_view buffer_08;
  string_view buffer_09;
  string_view buffer_10;
  string_view buffer_11;
  string_view buffer_12;
  string_view buffer_13;
  string_view buffer_14;
  string_view buffer_15;
  string_view buffer_16;
  string_view buffer_17;
  string_view buffer_18;
  string_view buffer_19;
  string_view buffer_20;
  string_view buffer_21;
  string_view buffer_22;
  string_view buffer_23;
  string_view buffer_24;
  string_view buffer_25;
  string_view buffer_26;
  string_view buffer_27;
  string_view buffer_28;
  string_view buffer_29;
  string_view buffer_30;
  string_view buffer_31;
  string_view buffer_32;
  string_view buffer_33;
  string_view buffer_34;
  string_view buffer_35;
  string_view buffer_36;
  string_view buffer_37;
  string_view buffer_38;
  string_view buffer_39;
  string_view buffer_40;
  string_view buffer_41;
  string_view buffer_42;
  string_view buffer_43;
  string_view buffer_44;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_7d0;
  bool local_7b0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_7a8;
  bool local_788;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_780;
  bool local_760;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_758;
  bool local_738;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_730;
  bool local_710;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_708;
  bool local_6e8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_6e0;
  bool local_6c0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_6b8;
  bool local_698;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_690;
  bool local_670;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_668;
  bool local_648;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_640;
  bool local_620;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_618;
  bool local_5f8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_5f0;
  bool local_5d0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_5c8;
  bool local_5a8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_5a0;
  bool local_580;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_578;
  bool local_558;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_550;
  bool local_530;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_528;
  bool local_508;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_500;
  bool local_4e0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_4d8;
  bool local_4b8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_4b0;
  bool local_490;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_488;
  bool local_468;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_460;
  bool local_440;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_438;
  bool local_418;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_410;
  bool local_3f0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_3e8;
  bool local_3c8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_3c0;
  bool local_3a0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_398;
  bool local_378;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_370;
  bool local_350;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_348;
  bool local_328;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_320;
  bool local_300;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_2f8;
  bool local_2d8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_2d0;
  bool local_2b0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_2a8;
  bool local_288;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_280;
  bool local_260;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_258;
  bool local_238;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_230;
  bool local_210;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_208;
  bool local_1e8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1e0;
  bool local_1c0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1b8;
  bool local_198;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_190;
  bool local_170;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_168;
  bool local_148;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_140;
  bool local_120;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_118;
  bool local_f8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_f0;
  bool local_d0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_c8;
  bool local_a8;
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_80;
  bool local_60;
  _Storage<unsigned_long,_true> local_48;
  undefined1 local_40;
  AssertHelper local_38;
  internal local_30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  
  local_7b0 = false;
  buffer._M_str = "0x0";
  buffer._M_len = 3;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_7d0);
  uVar1 = ::wasm::WATParser::Lexer::takeU<unsigned_char>();
  local_48._M_value._0_2_ = uVar1;
  local_38.data_ = local_38.data_ & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<std::optional<unsigned_char>,unsigned_char>
            (local_30,"Lexer(\"0x0\"sv).takeU8()","uint8_t(0)",(optional<unsigned_char> *)&local_48,
             (uchar *)&local_38);
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_7b0 == true) {
    local_7b0 = false;
    if (local_7d0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_7d0._M_value + 0x10)) {
      operator_delete((void *)local_7d0._M_value._M_dataplus._M_p,local_7d0._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xb7,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_788 = false;
  buffer_00._M_str = "0x0";
  buffer_00._M_len = 3;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_00,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_7a8);
  uVar1 = ::wasm::WATParser::Lexer::takeI<unsigned_char>();
  local_48._M_value._0_2_ = uVar1;
  local_38.data_ = local_38.data_ & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<std::optional<unsigned_char>,unsigned_char>
            (local_30,"Lexer(\"0x0\"sv).takeI8()","uint8_t(0)",(optional<unsigned_char> *)&local_48,
             (uchar *)&local_38);
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_788 == true) {
    local_788 = false;
    if (local_7a8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_7a8._M_value + 0x10)) {
      operator_delete((void *)local_7a8._M_value._M_dataplus._M_p,local_7a8._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xb8,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_760 = false;
  buffer_01._M_str = "0x0";
  buffer_01._M_len = 3;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_01,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_780);
  uVar2 = ::wasm::WATParser::Lexer::takeI<unsigned_short>();
  local_48._M_value._0_4_ = uVar2;
  local_38.data_ = local_38.data_ & 0xffffffffffff0000;
  testing::internal::CmpHelperEQ<std::optional<unsigned_short>,unsigned_short>
            (local_30,"Lexer(\"0x0\"sv).takeI16()","uint16_t(0)",
             (optional<unsigned_short> *)&local_48,(unsigned_short *)&local_38);
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_760 == true) {
    local_760 = false;
    if (local_780._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_780._M_value + 0x10)) {
      operator_delete((void *)local_780._M_value._M_dataplus._M_p,local_780._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xb9,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_a0._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_738 = false;
  buffer_02._M_str = "0x0";
  buffer_02._M_len = 3;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_02,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_758);
  local_48._M_value = ::wasm::WATParser::Lexer::takeU<unsigned_int>();
  local_38.data_ = local_38.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<std::optional<unsigned_int>,unsigned_int>
            (local_30,"Lexer(\"0x0\"sv).takeU32()","uint32_t(0)",(optional<unsigned_int> *)&local_48
             ,(uint *)&local_38);
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_738 == true) {
    local_738 = false;
    if (local_758._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_758._M_value + 0x10)) {
      operator_delete((void *)local_758._M_value._M_dataplus._M_p,local_758._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xba,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_710 = false;
  buffer_03._M_str = "0x0";
  buffer_03._M_len = 3;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_03,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_730);
  local_48._M_value = ::wasm::WATParser::Lexer::takeI<unsigned_int>();
  local_38.data_ = local_38.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<std::optional<unsigned_int>,unsigned_int>
            (local_30,"Lexer(\"0x0\"sv).takeI32()","uint32_t(0)",(optional<unsigned_int> *)&local_48
             ,(uint *)&local_38);
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_710 == true) {
    local_710 = false;
    if (local_730._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_730._M_value + 0x10)) {
      operator_delete((void *)local_730._M_value._M_dataplus._M_p,local_730._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xbb,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_a0._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_6e8 = false;
  buffer_04._M_str = "0x0";
  buffer_04._M_len = 3;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_04,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_708);
  local_48._M_value = ::wasm::WATParser::Lexer::takeU<unsigned_long>();
  local_38.data_ = (AssertHelperData *)0x0;
  local_40 = extraout_DL;
  testing::internal::CmpHelperEQ<std::optional<unsigned_long>,unsigned_long>
            (local_30,"Lexer(\"0x0\"sv).takeU64()","uint64_t(0)",
             (optional<unsigned_long> *)&local_48,(unsigned_long *)&local_38);
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_6e8 == true) {
    local_6e8 = false;
    if (local_708._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_708._M_value + 0x10)) {
      operator_delete((void *)local_708._M_value._M_dataplus._M_p,local_708._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xbc,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_6c0 = false;
  buffer_05._M_str = "0x0";
  buffer_05._M_len = 3;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_05,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_6e0);
  local_48._M_value = ::wasm::WATParser::Lexer::takeI<unsigned_long>();
  local_38.data_ = (AssertHelperData *)0x0;
  local_40 = extraout_DL_00;
  testing::internal::CmpHelperEQ<std::optional<unsigned_long>,unsigned_long>
            (local_30,"Lexer(\"0x0\"sv).takeI64()","uint64_t(0)",
             (optional<unsigned_long> *)&local_48,(unsigned_long *)&local_38);
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_6c0 == true) {
    local_6c0 = false;
    if (local_6e0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_6e0._M_value + 0x10)) {
      operator_delete((void *)local_6e0._M_value._M_dataplus._M_p,local_6e0._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xbd,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_a0._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_698 = false;
  buffer_06._M_str = "+0x0";
  buffer_06._M_len = 4;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_06,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_6b8);
  uVar3 = ::wasm::WATParser::Lexer::takeU<unsigned_char>();
  local_30[0] = (internal)((uVar3 >> 8 & 1) == 0);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_698 == true) {
    local_698 = false;
    if (local_6b8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_6b8._M_value + 0x10)) {
      operator_delete((void *)local_6b8._M_value._M_dataplus._M_p,local_6b8._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,local_30,(AssertionResult *)"Lexer(\"+0x0\"sv).takeU8()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xbf,(char *)local_a0._0_8_);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a0 + 0x10)
       ) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1));
    }
    if ((long *)local_48._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_670 = false;
  buffer_07._M_str = "+0x0";
  buffer_07._M_len = 4;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_07,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_690);
  uVar1 = ::wasm::WATParser::Lexer::takeI<unsigned_char>();
  local_48._M_value._0_2_ = uVar1;
  local_38.data_ = local_38.data_ & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<std::optional<unsigned_char>,unsigned_char>
            (local_30,"Lexer(\"+0x0\"sv).takeI8()","uint8_t(0)",(optional<unsigned_char> *)&local_48
             ,(uchar *)&local_38);
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_670 == true) {
    local_670 = false;
    if (local_690._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_690._M_value + 0x10)) {
      operator_delete((void *)local_690._M_value._M_dataplus._M_p,local_690._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xc0,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_648 = false;
  buffer_08._M_str = "-0x0";
  buffer_08._M_len = 4;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_08,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_668);
  uVar3 = ::wasm::WATParser::Lexer::takeU<unsigned_char>();
  local_30[0] = (internal)((uVar3 >> 8 & 1) == 0);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_648 == true) {
    local_648 = false;
    if (local_668._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_668._M_value + 0x10)) {
      operator_delete((void *)local_668._M_value._M_dataplus._M_p,local_668._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,local_30,(AssertionResult *)"Lexer(\"-0x0\"sv).takeU8()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xc2,(char *)local_a0._0_8_);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_a0._0_8_ != (long)local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1));
    }
    if ((long *)local_48._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_620 = false;
  buffer_09._M_str = "-0x0";
  buffer_09._M_len = 4;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_09,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_640);
  uVar1 = ::wasm::WATParser::Lexer::takeI<unsigned_char>();
  local_48._M_value._0_2_ = uVar1;
  local_38.data_ = local_38.data_ & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<std::optional<unsigned_char>,unsigned_char>
            (local_30,"Lexer(\"-0x0\"sv).takeI8()","uint8_t(0)",(optional<unsigned_char> *)&local_48
             ,(uchar *)&local_38);
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_620 == true) {
    local_620 = false;
    if (local_640._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_640._M_value + 0x10)) {
      operator_delete((void *)local_640._M_value._M_dataplus._M_p,local_640._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xc3,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_a0._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_5f8 = false;
  buffer_10._M_str = "0x1";
  buffer_10._M_len = 3;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_10,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_618);
  uVar1 = ::wasm::WATParser::Lexer::takeU<unsigned_char>();
  local_48._M_value._0_2_ = uVar1;
  local_38.data_._0_1_ = 1;
  testing::internal::CmpHelperEQ<std::optional<unsigned_char>,unsigned_char>
            (local_30,"Lexer(\"0x1\"sv).takeU8()","uint8_t(1)",(optional<unsigned_char> *)&local_48,
             (uchar *)&local_38);
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_5f8 == true) {
    local_5f8 = false;
    if (local_618._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_618._M_value + 0x10)) {
      operator_delete((void *)local_618._M_value._M_dataplus._M_p,local_618._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xc5,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_5d0 = false;
  buffer_11._M_str = "0x1";
  buffer_11._M_len = 3;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_11,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_5f0);
  uVar1 = ::wasm::WATParser::Lexer::takeI<unsigned_char>();
  local_48._M_value._0_2_ = uVar1;
  local_38.data_._0_1_ = 1;
  testing::internal::CmpHelperEQ<std::optional<unsigned_char>,unsigned_char>
            (local_30,"Lexer(\"0x1\"sv).takeI8()","uint8_t(1)",(optional<unsigned_char> *)&local_48,
             (uchar *)&local_38);
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_5d0 == true) {
    local_5d0 = false;
    if (local_5f0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_5f0._M_value + 0x10)) {
      operator_delete((void *)local_5f0._M_value._M_dataplus._M_p,local_5f0._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xc6,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_a0._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_5a8 = false;
  buffer_12._M_str = "+0x1";
  buffer_12._M_len = 4;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_12,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_5c8);
  uVar3 = ::wasm::WATParser::Lexer::takeU<unsigned_char>();
  local_30[0] = (internal)((uVar3 >> 8 & 1) == 0);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_5a8 == true) {
    local_5a8 = false;
    if (local_5c8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_5c8._M_value + 0x10)) {
      operator_delete((void *)local_5c8._M_value._M_dataplus._M_p,local_5c8._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,local_30,(AssertionResult *)"Lexer(\"+0x1\"sv).takeU8()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,200,(char *)local_a0._0_8_);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a0 + 0x10)
       ) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1));
    }
    if ((long *)local_48._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_580 = false;
  buffer_13._M_str = "+0x1";
  buffer_13._M_len = 4;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_13,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_5a0);
  uVar1 = ::wasm::WATParser::Lexer::takeI<unsigned_char>();
  local_48._M_value._0_2_ = uVar1;
  local_38.data_._0_1_ = 1;
  testing::internal::CmpHelperEQ<std::optional<unsigned_char>,unsigned_char>
            (local_30,"Lexer(\"+0x1\"sv).takeI8()","uint8_t(1)",(optional<unsigned_char> *)&local_48
             ,(uchar *)&local_38);
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_580 == true) {
    local_580 = false;
    if (local_5a0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_5a0._M_value + 0x10)) {
      operator_delete((void *)local_5a0._M_value._M_dataplus._M_p,local_5a0._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xc9,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_558 = false;
  buffer_14._M_str = "-0x1";
  buffer_14._M_len = 4;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_14,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_578);
  uVar3 = ::wasm::WATParser::Lexer::takeU<unsigned_char>();
  local_30[0] = (internal)((uVar3 >> 8 & 1) == 0);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_558 == true) {
    local_558 = false;
    if (local_578._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_578._M_value + 0x10)) {
      operator_delete((void *)local_578._M_value._M_dataplus._M_p,local_578._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,local_30,(AssertionResult *)"Lexer(\"-0x1\"sv).takeU8()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xcb,(char *)local_a0._0_8_);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_a0._0_8_ != (long)local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1));
    }
    if ((long *)local_48._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_530 = false;
  buffer_15._M_str = "-0x1";
  buffer_15._M_len = 4;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_15,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_550);
  uVar1 = ::wasm::WATParser::Lexer::takeI<unsigned_char>();
  local_48._M_value._0_2_ = uVar1;
  local_38.data_._0_1_ = 0xff;
  testing::internal::CmpHelperEQ<std::optional<unsigned_char>,unsigned_char>
            (local_30,"Lexer(\"-0x1\").takeI8()","uint8_t(-1)",(optional<unsigned_char> *)&local_48,
             (uchar *)&local_38);
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_530 == true) {
    local_530 = false;
    if (local_550._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_550._M_value + 0x10)) {
      operator_delete((void *)local_550._M_value._M_dataplus._M_p,local_550._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xcc,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_a0._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_508 = false;
  buffer_16._M_str = "0x0010";
  buffer_16._M_len = 6;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_16,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_528);
  uVar1 = ::wasm::WATParser::Lexer::takeU<unsigned_char>();
  local_48._M_value._0_2_ = uVar1;
  local_38.data_._0_1_ = 0x10;
  testing::internal::CmpHelperEQ<std::optional<unsigned_char>,unsigned_char>
            (local_30,"Lexer(\"0x0010\"sv).takeU8()","uint8_t(16)",
             (optional<unsigned_char> *)&local_48,(uchar *)&local_38);
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_508 == true) {
    local_508 = false;
    if (local_528._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_528._M_value + 0x10)) {
      operator_delete((void *)local_528._M_value._M_dataplus._M_p,local_528._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xce,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_4e0 = false;
  buffer_17._M_str = "0x0010";
  buffer_17._M_len = 6;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_17,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_500);
  uVar1 = ::wasm::WATParser::Lexer::takeI<unsigned_char>();
  local_48._M_value._0_2_ = uVar1;
  local_38.data_._0_1_ = 0x10;
  testing::internal::CmpHelperEQ<std::optional<unsigned_char>,unsigned_char>
            (local_30,"Lexer(\"0x0010\"sv).takeI8()","uint8_t(16)",
             (optional<unsigned_char> *)&local_48,(uchar *)&local_38);
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_4e0 == true) {
    local_4e0 = false;
    if (local_500._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_500._M_value + 0x10)) {
      operator_delete((void *)local_500._M_value._M_dataplus._M_p,local_500._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xcf,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_a0._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_4b8 = false;
  buffer_18._M_str = "+0x0010";
  buffer_18._M_len = 7;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_18,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_4d8);
  uVar3 = ::wasm::WATParser::Lexer::takeU<unsigned_char>();
  local_30[0] = (internal)((uVar3 >> 8 & 1) == 0);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_4b8 == true) {
    local_4b8 = false;
    if (local_4d8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_4d8._M_value + 0x10)) {
      operator_delete((void *)local_4d8._M_value._M_dataplus._M_p,local_4d8._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,local_30,(AssertionResult *)"Lexer(\"+0x0010\"sv).takeU8()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xd1,(char *)local_a0._0_8_);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a0 + 0x10)
       ) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1));
    }
    if ((long *)local_48._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_490 = false;
  buffer_19._M_str = "+0x0010";
  buffer_19._M_len = 7;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_19,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_4b0);
  uVar1 = ::wasm::WATParser::Lexer::takeI<unsigned_char>();
  local_48._M_value._0_2_ = uVar1;
  local_38.data_._0_1_ = 0x10;
  testing::internal::CmpHelperEQ<std::optional<unsigned_char>,unsigned_char>
            (local_30,"Lexer(\"+0x0010\"sv).takeI8()","uint8_t(16)",
             (optional<unsigned_char> *)&local_48,(uchar *)&local_38);
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_490 == true) {
    local_490 = false;
    if (local_4b0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_4b0._M_value + 0x10)) {
      operator_delete((void *)local_4b0._M_value._M_dataplus._M_p,local_4b0._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xd2,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_468 = false;
  buffer_20._M_str = "-0x0010";
  buffer_20._M_len = 7;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_20,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_488);
  uVar3 = ::wasm::WATParser::Lexer::takeU<unsigned_char>();
  local_30[0] = (internal)((uVar3 >> 8 & 1) == 0);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_468 == true) {
    local_468 = false;
    if (local_488._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_488._M_value + 0x10)) {
      operator_delete((void *)local_488._M_value._M_dataplus._M_p,local_488._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,local_30,(AssertionResult *)"Lexer(\"-0x0010\"sv).takeU8()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xd4,(char *)local_a0._0_8_);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_a0._0_8_ != (long)local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1));
    }
    if ((long *)local_48._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_440 = false;
  buffer_21._M_str = "-0x0010";
  buffer_21._M_len = 7;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_21,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_460);
  uVar1 = ::wasm::WATParser::Lexer::takeI<unsigned_char>();
  local_48._M_value._0_2_ = uVar1;
  local_38.data_._0_1_ = 0xf0;
  testing::internal::CmpHelperEQ<std::optional<unsigned_char>,unsigned_char>
            (local_30,"Lexer(\"-0x0010\"sv).takeI8()","uint8_t(-16)",
             (optional<unsigned_char> *)&local_48,(uchar *)&local_38);
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_440 == true) {
    local_440 = false;
    if (local_460._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_460._M_value + 0x10)) {
      operator_delete((void *)local_460._M_value._M_dataplus._M_p,local_460._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xd5,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_a0._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_418 = false;
  buffer_22._M_str = "0xabcdef";
  buffer_22._M_len = 8;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_22,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_438);
  uVar3 = ::wasm::WATParser::Lexer::takeU<unsigned_char>();
  local_30[0] = (internal)((uVar3 >> 8 & 1) == 0);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_418 == true) {
    local_418 = false;
    if (local_438._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_438._M_value + 0x10)) {
      operator_delete((void *)local_438._M_value._M_dataplus._M_p,local_438._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,local_30,(AssertionResult *)"Lexer(\"0xabcdef\"sv).takeU8()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xd7,(char *)local_a0._0_8_);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a0 + 0x10)
       ) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1));
    }
    if ((long *)local_48._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_3f0 = false;
  buffer_23._M_str = "0xabcdef";
  buffer_23._M_len = 8;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_23,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_410);
  local_48._M_value = ::wasm::WATParser::Lexer::takeU<unsigned_int>();
  local_38.data_._0_4_ = 0xabcdef;
  testing::internal::CmpHelperEQ<std::optional<unsigned_int>,unsigned_int>
            (local_30,"Lexer(\"0xabcdef\"sv).takeU32()","uint32_t(0xabcdef)",
             (optional<unsigned_int> *)&local_48,(uint *)&local_38);
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_3f0 == true) {
    local_3f0 = false;
    if (local_410._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_410._M_value + 0x10)) {
      operator_delete((void *)local_410._M_value._M_dataplus._M_p,local_410._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xd8,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_3c8 = false;
  buffer_24._M_str = "0xabcdef";
  buffer_24._M_len = 8;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_24,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_3e8);
  local_48._M_value = ::wasm::WATParser::Lexer::takeI<unsigned_int>();
  local_38.data_._0_4_ = 0xabcdef;
  testing::internal::CmpHelperEQ<std::optional<unsigned_int>,unsigned_int>
            (local_30,"Lexer(\"0xabcdef\"sv).takeI32()","uint32_t(0xabcdef)",
             (optional<unsigned_int> *)&local_48,(uint *)&local_38);
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_3c8 == true) {
    local_3c8 = false;
    if (local_3e8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_3e8._M_value + 0x10)) {
      operator_delete((void *)local_3e8._M_value._M_dataplus._M_p,local_3e8._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xd9,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_a0._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_3a0 = false;
  buffer_25._M_str = "+0xABCDEF";
  buffer_25._M_len = 9;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_25,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_3c0);
  uVar4 = ::wasm::WATParser::Lexer::takeU<unsigned_int>();
  local_30[0] = (internal)((uVar4 >> 0x20 & 1) == 0);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_3a0 == true) {
    local_3a0 = false;
    if (local_3c0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_3c0._M_value + 0x10)) {
      operator_delete((void *)local_3c0._M_value._M_dataplus._M_p,local_3c0._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,local_30,(AssertionResult *)"Lexer(\"+0xABCDEF\"sv).takeU32()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xdb,(char *)local_a0._0_8_);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a0 + 0x10)
       ) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1));
    }
    if ((long *)local_48._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_378 = false;
  buffer_26._M_str = "+0xABCDEF";
  buffer_26._M_len = 9;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_26,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_398);
  local_48._M_value = ::wasm::WATParser::Lexer::takeI<unsigned_int>();
  local_38.data_._0_4_ = 0xabcdef;
  testing::internal::CmpHelperEQ<std::optional<unsigned_int>,unsigned_int>
            (local_30,"Lexer(\"+0xABCDEF\"sv).takeI32()","uint32_t(0xabcdef)",
             (optional<unsigned_int> *)&local_48,(uint *)&local_38);
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_378 == true) {
    local_378 = false;
    if (local_398._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_398._M_value + 0x10)) {
      operator_delete((void *)local_398._M_value._M_dataplus._M_p,local_398._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xdc,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_350 = false;
  buffer_27._M_str = "-0xAbCdEf";
  buffer_27._M_len = 9;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_27,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_370);
  uVar4 = ::wasm::WATParser::Lexer::takeU<unsigned_int>();
  local_30[0] = (internal)((uVar4 & 0x100000000) == 0);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_350 == true) {
    local_350 = false;
    if (local_370._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_370._M_value + 0x10)) {
      operator_delete((void *)local_370._M_value._M_dataplus._M_p,local_370._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,local_30,(AssertionResult *)"Lexer(\"-0xAbCdEf\"sv).takeU32()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xde,(char *)local_a0._0_8_);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_a0._0_8_ != (long)local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1));
    }
    if ((long *)local_48._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_328 = false;
  buffer_28._M_str = "-0xAbCdEf";
  buffer_28._M_len = 9;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_28,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_348);
  local_48._M_value = ::wasm::WATParser::Lexer::takeI<unsigned_int>();
  local_38.data_._0_4_ = 0xff543211;
  testing::internal::CmpHelperEQ<std::optional<unsigned_int>,unsigned_int>
            (local_30,"Lexer(\"-0xAbCdEf\"sv).takeI32()","uint32_t(-0xabcdef)",
             (optional<unsigned_int> *)&local_48,(uint *)&local_38);
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_328 == true) {
    local_328 = false;
    if (local_348._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_348._M_value + 0x10)) {
      operator_delete((void *)local_348._M_value._M_dataplus._M_p,local_348._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xdf,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_a0._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_300 = false;
  buffer_29._M_str = "0x12_34";
  buffer_29._M_len = 7;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_29,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_320);
  local_48._M_value = ::wasm::WATParser::Lexer::takeU<unsigned_int>();
  local_38.data_._0_4_ = 0x1234;
  testing::internal::CmpHelperEQ<std::optional<unsigned_int>,unsigned_int>
            (local_30,"Lexer(\"0x12_34\"sv).takeU32()","uint32_t(0x1234)",
             (optional<unsigned_int> *)&local_48,(uint *)&local_38);
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_300 == true) {
    local_300 = false;
    if (local_320._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_320._M_value + 0x10)) {
      operator_delete((void *)local_320._M_value._M_dataplus._M_p,local_320._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xe1,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_2d8 = false;
  buffer_30._M_str = "0x12_34";
  buffer_30._M_len = 7;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_30,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_2f8);
  local_48._M_value = ::wasm::WATParser::Lexer::takeI<unsigned_int>();
  local_38.data_._0_4_ = 0x1234;
  testing::internal::CmpHelperEQ<std::optional<unsigned_int>,unsigned_int>
            (local_30,"Lexer(\"0x12_34\"sv).takeI32()","uint32_t(0x1234)",
             (optional<unsigned_int> *)&local_48,(uint *)&local_38);
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_2d8 == true) {
    local_2d8 = false;
    if (local_2f8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_2f8._M_value + 0x10)) {
      operator_delete((void *)local_2f8._M_value._M_dataplus._M_p,local_2f8._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xe2,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_a0._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_2b0 = false;
  buffer_31._M_str = "0x1_2_3_4";
  buffer_31._M_len = 9;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_31,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_2d0);
  local_48._M_value = ::wasm::WATParser::Lexer::takeU<unsigned_int>();
  local_38.data_._0_4_ = 0x1234;
  testing::internal::CmpHelperEQ<std::optional<unsigned_int>,unsigned_int>
            (local_30,"Lexer(\"0x1_2_3_4\"sv).takeU32()","uint32_t(0x1234)",
             (optional<unsigned_int> *)&local_48,(uint *)&local_38);
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_2b0 == true) {
    local_2b0 = false;
    if (local_2d0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_2d0._M_value + 0x10)) {
      operator_delete((void *)local_2d0._M_value._M_dataplus._M_p,local_2d0._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xe4,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_288 = false;
  buffer_32._M_str = "0x1_2_3_4";
  buffer_32._M_len = 9;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_32,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_2a8);
  local_48._M_value = ::wasm::WATParser::Lexer::takeI<unsigned_int>();
  local_38.data_._0_4_ = 0x1234;
  testing::internal::CmpHelperEQ<std::optional<unsigned_int>,unsigned_int>
            (local_30,"Lexer(\"0x1_2_3_4\"sv).takeI32()","uint32_t(0x1234)",
             (optional<unsigned_int> *)&local_48,(uint *)&local_38);
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_288 == true) {
    local_288 = false;
    if (local_2a8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_2a8._M_value + 0x10)) {
      operator_delete((void *)local_2a8._M_value._M_dataplus._M_p,local_2a8._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xe5,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_a0._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_260 = false;
  buffer_33._M_str = "_0x1234";
  buffer_33._M_len = 7;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_33,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_280);
  uVar4 = ::wasm::WATParser::Lexer::takeU<unsigned_int>();
  local_30[0] = (internal)((uVar4 & 0x100000000) == 0);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_260 == true) {
    local_260 = false;
    if (local_280._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_280._M_value + 0x10)) {
      operator_delete((void *)local_280._M_value._M_dataplus._M_p,local_280._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,local_30,(AssertionResult *)"Lexer(\"_0x1234\"sv).takeU32()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xe7,(char *)local_a0._0_8_);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a0 + 0x10)
       ) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1));
    }
    if ((long *)local_48._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_238 = false;
  buffer_34._M_str = "_0x1234";
  buffer_34._M_len = 7;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_34,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_258);
  uVar4 = ::wasm::WATParser::Lexer::takeI<unsigned_int>();
  local_30[0] = (internal)((uVar4 & 0x100000000) == 0);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_238 == true) {
    local_238 = false;
    if (local_258._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_258._M_value + 0x10)) {
      operator_delete((void *)local_258._M_value._M_dataplus._M_p,local_258._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,local_30,(AssertionResult *)"Lexer(\"_0x1234\"sv).takeI32()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xe8,(char *)local_a0._0_8_);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a0 + 0x10)
       ) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1));
    }
    if ((long *)local_48._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_210 = false;
  buffer_35._M_str = "0x_1234";
  buffer_35._M_len = 7;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_35,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_230);
  uVar4 = ::wasm::WATParser::Lexer::takeU<unsigned_int>();
  local_30[0] = (internal)((uVar4 & 0x100000000) == 0);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_210 == true) {
    local_210 = false;
    if (local_230._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_230._M_value + 0x10)) {
      operator_delete((void *)local_230._M_value._M_dataplus._M_p,local_230._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,local_30,(AssertionResult *)"Lexer(\"0x_1234\"sv).takeU32()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xea,(char *)local_a0._0_8_);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a0 + 0x10)
       ) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1));
    }
    if ((long *)local_48._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_1e8 = false;
  buffer_36._M_str = "0x_1234";
  buffer_36._M_len = 7;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_36,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_208);
  uVar4 = ::wasm::WATParser::Lexer::takeI<unsigned_int>();
  local_30[0] = (internal)((uVar4 & 0x100000000) == 0);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_1e8 == true) {
    local_1e8 = false;
    if (local_208._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_208._M_value + 0x10)) {
      operator_delete((void *)local_208._M_value._M_dataplus._M_p,local_208._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,local_30,(AssertionResult *)"Lexer(\"0x_1234\"sv).takeI32()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xeb,(char *)local_a0._0_8_);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a0 + 0x10)
       ) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1));
    }
    if ((long *)local_48._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_1c0 = false;
  buffer_37._M_str = "0x1234_";
  buffer_37._M_len = 7;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_37,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1e0);
  uVar4 = ::wasm::WATParser::Lexer::takeU<unsigned_int>();
  local_30[0] = (internal)((uVar4 & 0x100000000) == 0);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_1c0 == true) {
    local_1c0 = false;
    if (local_1e0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_1e0._M_value + 0x10)) {
      operator_delete((void *)local_1e0._M_value._M_dataplus._M_p,local_1e0._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,local_30,(AssertionResult *)"Lexer(\"0x1234_\"sv).takeU32()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xed,(char *)local_a0._0_8_);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a0 + 0x10)
       ) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1));
    }
    if ((long *)local_48._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_198 = false;
  buffer_38._M_str = "0x1234_";
  buffer_38._M_len = 7;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_38,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1b8);
  uVar4 = ::wasm::WATParser::Lexer::takeI<unsigned_int>();
  local_30[0] = (internal)((uVar4 & 0x100000000) == 0);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_198 == true) {
    local_198 = false;
    if (local_1b8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_1b8._M_value + 0x10)) {
      operator_delete((void *)local_1b8._M_value._M_dataplus._M_p,local_1b8._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,local_30,(AssertionResult *)"Lexer(\"0x1234_\"sv).takeI32()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xee,(char *)local_a0._0_8_);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a0 + 0x10)
       ) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1));
    }
    if ((long *)local_48._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_170 = false;
  buffer_39._M_str = "0x12__34";
  buffer_39._M_len = 8;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_39,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_190);
  uVar4 = ::wasm::WATParser::Lexer::takeU<unsigned_int>();
  local_30[0] = (internal)((uVar4 & 0x100000000) == 0);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_170 == true) {
    local_170 = false;
    if (local_190._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_190._M_value + 0x10)) {
      operator_delete((void *)local_190._M_value._M_dataplus._M_p,local_190._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,local_30,(AssertionResult *)"Lexer(\"0x12__34\"sv).takeU32()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xf0,(char *)local_a0._0_8_);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a0 + 0x10)
       ) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1));
    }
    if ((long *)local_48._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_148 = false;
  buffer_40._M_str = "0x12__34";
  buffer_40._M_len = 8;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_40,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_168);
  uVar4 = ::wasm::WATParser::Lexer::takeI<unsigned_int>();
  local_30[0] = (internal)((uVar4 & 0x100000000) == 0);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_148 == true) {
    local_148 = false;
    if (local_168._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_168._M_value + 0x10)) {
      operator_delete((void *)local_168._M_value._M_dataplus._M_p,local_168._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,local_30,(AssertionResult *)"Lexer(\"0x12__34\"sv).takeI32()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xf1,(char *)local_a0._0_8_);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a0 + 0x10)
       ) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1));
    }
    if ((long *)local_48._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_120 = false;
  buffer_41._M_str = "0xg";
  buffer_41._M_len = 3;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_41,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_140);
  uVar4 = ::wasm::WATParser::Lexer::takeU<unsigned_int>();
  local_30[0] = (internal)((uVar4 & 0x100000000) == 0);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_120 == true) {
    local_120 = false;
    if (local_140._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_140._M_value + 0x10)) {
      operator_delete((void *)local_140._M_value._M_dataplus._M_p,local_140._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,local_30,(AssertionResult *)"Lexer(\"0xg\"sv).takeU32()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xf3,(char *)local_a0._0_8_);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a0 + 0x10)
       ) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1));
    }
    if ((long *)local_48._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_f8 = false;
  buffer_42._M_str = "0xg";
  buffer_42._M_len = 3;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_42,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_118);
  uVar4 = ::wasm::WATParser::Lexer::takeI<unsigned_int>();
  local_30[0] = (internal)((uVar4 & 0x100000000) == 0);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_f8 == true) {
    local_f8 = false;
    if (local_118._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_118._M_value + 0x10)) {
      operator_delete((void *)local_118._M_value._M_dataplus._M_p,local_118._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,local_30,(AssertionResult *)"Lexer(\"0xg\"sv).takeI32()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xf4,(char *)local_a0._0_8_);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a0 + 0x10)
       ) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1));
    }
    if ((long *)local_48._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_d0 = false;
  buffer_43._M_str = "0x120x34";
  buffer_43._M_len = 8;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_43,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_f0);
  uVar4 = ::wasm::WATParser::Lexer::takeU<unsigned_int>();
  local_30[0] = (internal)((uVar4 & 0x100000000) == 0);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_d0 == true) {
    local_d0 = false;
    if (local_f0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_f0._M_value + 0x10)) {
      operator_delete((void *)local_f0._M_value._M_dataplus._M_p,local_f0._16_8_ + 1);
    }
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,local_30,(AssertionResult *)"Lexer(\"0x120x34\"sv).takeU32()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xf6,(char *)local_a0._0_8_);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a0 + 0x10)
       ) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1));
    }
    if ((long *)local_48._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_a8 = false;
  buffer_44._M_str = "0x120x34";
  buffer_44._M_len = 8;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a0,buffer_44,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_c8);
  uVar4 = ::wasm::WATParser::Lexer::takeI<unsigned_int>();
  local_30[0] = (internal)((uVar4 & 0x100000000) == 0);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_80._M_value + 0x10)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
  }
  if (local_a8 == true) {
    local_a8 = false;
    if (local_c8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_c8._M_value + 0x10)) {
      operator_delete((void *)local_c8._M_value._M_dataplus._M_p,local_c8._16_8_ + 1);
    }
  }
  if ((uVar4 & 0x100000000) != 0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,local_30,(AssertionResult *)"Lexer(\"0x120x34\"sv).takeI32()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xf7,(char *)local_a0._0_8_);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_a0._0_8_ != (long)local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1));
    }
    if ((long *)local_48._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
    if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_28,local_28);
    }
  }
  return;
}

Assistant:

TEST(LexerTest, LexHexInt) {
  EXPECT_EQ(Lexer("0x0"sv).takeU8(), uint8_t(0));
  EXPECT_EQ(Lexer("0x0"sv).takeI8(), uint8_t(0));
  EXPECT_EQ(Lexer("0x0"sv).takeI16(), uint16_t(0));
  EXPECT_EQ(Lexer("0x0"sv).takeU32(), uint32_t(0));
  EXPECT_EQ(Lexer("0x0"sv).takeI32(), uint32_t(0));
  EXPECT_EQ(Lexer("0x0"sv).takeU64(), uint64_t(0));
  EXPECT_EQ(Lexer("0x0"sv).takeI64(), uint64_t(0));

  EXPECT_FALSE(Lexer("+0x0"sv).takeU8());
  EXPECT_EQ(Lexer("+0x0"sv).takeI8(), uint8_t(0));

  EXPECT_FALSE(Lexer("-0x0"sv).takeU8());
  EXPECT_EQ(Lexer("-0x0"sv).takeI8(), uint8_t(0));

  EXPECT_EQ(Lexer("0x1"sv).takeU8(), uint8_t(1));
  EXPECT_EQ(Lexer("0x1"sv).takeI8(), uint8_t(1));

  EXPECT_FALSE(Lexer("+0x1"sv).takeU8());
  EXPECT_EQ(Lexer("+0x1"sv).takeI8(), uint8_t(1));

  EXPECT_FALSE(Lexer("-0x1"sv).takeU8());
  EXPECT_EQ(Lexer("-0x1").takeI8(), uint8_t(-1));

  EXPECT_EQ(Lexer("0x0010"sv).takeU8(), uint8_t(16));
  EXPECT_EQ(Lexer("0x0010"sv).takeI8(), uint8_t(16));

  EXPECT_FALSE(Lexer("+0x0010"sv).takeU8());
  EXPECT_EQ(Lexer("+0x0010"sv).takeI8(), uint8_t(16));

  EXPECT_FALSE(Lexer("-0x0010"sv).takeU8());
  EXPECT_EQ(Lexer("-0x0010"sv).takeI8(), uint8_t(-16));

  EXPECT_FALSE(Lexer("0xabcdef"sv).takeU8());
  EXPECT_EQ(Lexer("0xabcdef"sv).takeU32(), uint32_t(0xabcdef));
  EXPECT_EQ(Lexer("0xabcdef"sv).takeI32(), uint32_t(0xabcdef));

  EXPECT_FALSE(Lexer("+0xABCDEF"sv).takeU32());
  EXPECT_EQ(Lexer("+0xABCDEF"sv).takeI32(), uint32_t(0xabcdef));

  EXPECT_FALSE(Lexer("-0xAbCdEf"sv).takeU32());
  EXPECT_EQ(Lexer("-0xAbCdEf"sv).takeI32(), uint32_t(-0xabcdef));

  EXPECT_EQ(Lexer("0x12_34"sv).takeU32(), uint32_t(0x1234));
  EXPECT_EQ(Lexer("0x12_34"sv).takeI32(), uint32_t(0x1234));

  EXPECT_EQ(Lexer("0x1_2_3_4"sv).takeU32(), uint32_t(0x1234));
  EXPECT_EQ(Lexer("0x1_2_3_4"sv).takeI32(), uint32_t(0x1234));

  EXPECT_FALSE(Lexer("_0x1234"sv).takeU32());
  EXPECT_FALSE(Lexer("_0x1234"sv).takeI32());

  EXPECT_FALSE(Lexer("0x_1234"sv).takeU32());
  EXPECT_FALSE(Lexer("0x_1234"sv).takeI32());

  EXPECT_FALSE(Lexer("0x1234_"sv).takeU32());
  EXPECT_FALSE(Lexer("0x1234_"sv).takeI32());

  EXPECT_FALSE(Lexer("0x12__34"sv).takeU32());
  EXPECT_FALSE(Lexer("0x12__34"sv).takeI32());

  EXPECT_FALSE(Lexer("0xg"sv).takeU32());
  EXPECT_FALSE(Lexer("0xg"sv).takeI32());

  EXPECT_FALSE(Lexer("0x120x34"sv).takeU32());
  EXPECT_FALSE(Lexer("0x120x34"sv).takeI32());
}